

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

int make_ga_colormap(png_image_read_control *display)

{
  uint red;
  uint uVar1;
  png_uint_32 pVar2;
  png_uint_32 red_00;
  int iVar3;
  
  uVar1 = 0x73;
  for (pVar2 = 0; pVar2 != 0xe7; pVar2 = pVar2 + 1) {
    red = (uVar1 & 0xffff) / 0xe7;
    png_create_colormap_entry(display,pVar2,red,red,red,0xff,1);
    uVar1 = uVar1 + 0x100;
  }
  png_create_colormap_entry(display,0xe7,0xff,0xff,0xff,0,1);
  pVar2 = 0xe8;
  for (iVar3 = 1; iVar3 != 5; iVar3 = iVar3 + 1) {
    for (red_00 = 0; red_00 != 0x132; red_00 = red_00 + 0x33) {
      png_create_colormap_entry(display,pVar2,red_00,red_00,red_00,iVar3 * 0x33,1);
      pVar2 = pVar2 + 1;
    }
  }
  return pVar2;
}

Assistant:

static int
make_ga_colormap(png_image_read_control *display)
{
   unsigned int i, a;

   /* Alpha is retained, the output will be a color-map with entries
    * selected by six levels of alpha.  One transparent entry, 6 gray
    * levels for all the intermediate alpha values, leaving 230 entries
    * for the opaque grays.  The color-map entries are the six values
    * [0..5]*51, the GA processing uses PNG_DIV51(value) to find the
    * relevant entry.
    *
    * if (alpha > 229) // opaque
    * {
    *    // The 231 entries are selected to make the math below work:
    *    base = 0;
    *    entry = (231 * gray + 128) >> 8;
    * }
    * else if (alpha < 26) // transparent
    * {
    *    base = 231;
    *    entry = 0;
    * }
    * else // partially opaque
    * {
    *    base = 226 + 6 * PNG_DIV51(alpha);
    *    entry = PNG_DIV51(gray);
    * }
    */
   i = 0;
   while (i < 231)
   {
      unsigned int gray = (i * 256 + 115) / 231;
      png_create_colormap_entry(display, i++, gray, gray, gray, 255, P_sRGB);
   }

   /* 255 is used here for the component values for consistency with the code
    * that undoes premultiplication in pngwrite.c.
    */
   png_create_colormap_entry(display, i++, 255, 255, 255, 0, P_sRGB);

   for (a=1; a<5; ++a)
   {
      unsigned int g;

      for (g=0; g<6; ++g)
         png_create_colormap_entry(display, i++, g*51, g*51, g*51, a*51,
             P_sRGB);
   }

   return (int)i;
}